

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

int Bmc_ComputeSimDiff(Gia_Man_t *p,Vec_Int_t *vPat,Vec_Int_t *vPat2)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  word *pwVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  
  lVar7 = (long)p->vCis->nSize;
  if (0 < lVar7) {
    piVar4 = p->vCis->pArray;
    lVar14 = 0;
    do {
      iVar11 = piVar4[lVar14];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_0058215c;
      if (iVar11 == 0) break;
      if (vPat->nSize <= lVar14) goto LAB_0058219a;
      if (p->vSims->nSize <= iVar11) goto LAB_0058217b;
      lVar1 = lVar14 + 1;
      p->vSims->pArray[iVar11] = 2L << ((byte)lVar14 & 0x3f) ^ -(ulong)(vPat->pArray[lVar14] != 0);
      lVar14 = lVar1;
    } while (lVar7 != lVar1);
  }
  uVar16 = p->nObjs;
  if ((0 < (int)uVar16) && (pGVar8 = p->pObjs, pGVar8 != (Gia_Obj_t *)0x0)) {
    uVar9 = 0;
    do {
      lVar7 = *(long *)pGVar8;
      uVar10 = (uint)lVar7;
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        uVar12 = -(uVar10 & 0x1fffffff) + uVar9;
        iVar11 = (int)uVar12;
        if (iVar11 < 0) goto LAB_0058213d;
        iVar2 = p->vSims->nSize;
        if (iVar2 <= iVar11) goto LAB_0058213d;
        uVar13 = -((uint)((ulong)lVar7 >> 0x20) & 0x1fffffff) + uVar9;
        iVar11 = (int)uVar13;
        if ((iVar11 < 0) || (iVar2 <= iVar11)) goto LAB_0058213d;
        if ((long)iVar2 <= (long)uVar9) goto LAB_0058217b;
        pwVar5 = p->vSims->pArray;
        pwVar5[uVar9] =
             ((lVar7 << 2) >> 0x3f ^ pwVar5[uVar13 & 0xffffffff]) &
             ((long)((int)(uVar10 * 4) >> 0x1f) ^ pwVar5[uVar12 & 0xffffffff]);
      }
      uVar9 = uVar9 + 1;
      pGVar8 = pGVar8 + 1;
    } while (uVar16 != uVar9);
  }
  pVVar6 = p->vCos;
  iVar11 = pVVar6->nSize;
  if (0 < (long)iVar11) {
    piVar4 = pVVar6->pArray;
    lVar7 = 0;
    do {
      iVar2 = piVar4[lVar7];
      lVar14 = (long)iVar2;
      if ((lVar14 < 0) || ((int)uVar16 <= iVar2)) goto LAB_0058215c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar10 = *(uint *)(p->pObjs + lVar14);
      uVar15 = iVar2 - (uVar10 & 0x1fffffff);
      if ((int)uVar15 < 0) goto LAB_0058213d;
      iVar3 = p->vSims->nSize;
      if (iVar3 <= (int)uVar15) goto LAB_0058213d;
      if (iVar3 <= iVar2) {
LAB_0058217b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      pwVar5 = p->vSims->pArray;
      pwVar5[lVar14] = (long)((int)(uVar10 << 2) >> 0x1f) ^ pwVar5[uVar15];
      lVar7 = lVar7 + 1;
    } while (iVar11 != lVar7);
  }
  if (iVar11 < 1) {
LAB_0058219a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar11 = *pVVar6->pArray;
  if ((-1 < (long)iVar11) && (iVar11 < (int)uVar16)) {
    if (iVar11 < p->vSims->nSize) {
      uVar9 = p->vSims->pArray[iVar11];
      vPat2->nSize = 0;
      uVar16 = (uint)uVar9;
      if (0 < p->vCis->nSize) {
        lVar7 = 0;
        do {
          lVar7 = lVar7 + 1;
          Vec_IntPush(vPat2,((uint)(uVar9 >> ((byte)lVar7 & 0x3f)) ^ uVar16) & 1);
        } while (lVar7 < p->vCis->nSize);
      }
      return uVar16 & 1;
    }
LAB_0058213d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                  ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
LAB_0058215c:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [For a given random pattern, compute output change.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Bmc_ComputeSimDiff( Gia_Man_t * p, Vec_Int_t * vPat, Vec_Int_t * vPat2 )
{
    Gia_Obj_t * pObj;
    int i, Id; word Sim, Sim0, Sim1;
    Gia_ManForEachCiId( p, Id, i )
    {
        Sim = Vec_IntEntry(vPat, i) ? ~(word)0 : 0;
        Sim ^= (word)1 << (i + 1);
        Vec_WrdWriteEntry( p->vSims, Id, Sim );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        Sim0 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId0(pObj, i) );
        Sim1 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId1(pObj, i) );
        Sim0 = Gia_ObjFaninC0(pObj) ? ~Sim0 : Sim0;
        Sim1 = Gia_ObjFaninC1(pObj) ? ~Sim1 : Sim1;
        Vec_WrdWriteEntry( p->vSims, i, Sim0 & Sim1 );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        Id = Gia_ObjId( p, pObj );
        Sim0 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId0(pObj, Id) );
        Sim0 = Gia_ObjFaninC0(pObj) ? ~Sim0 : Sim0;
        Vec_WrdWriteEntry( p->vSims, Id, Sim0 );
    }
    pObj = Gia_ManCo( p, 0 );
    Sim = Vec_WrdEntry( p->vSims, Gia_ObjId(p, pObj) );
    Vec_IntClear( vPat2 );
    for ( i = 1; i <= Gia_ManCiNum(p); i++ )
        Vec_IntPush( vPat2, (int)((Sim & 1) ^ ((Sim >> i) & 1)) );
    return (int)(Sim & 1);
}